

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void units::addUnitFlagStrings(precise_unit *un,string *unitString)

{
  if (((un->base_units_).field_0x3 & 0x20) != 0) {
    if (unitString->_M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)unitString,0,(char *)0x0,0x1930ec);
    }
    else {
      std::__cxx11::string::append((char *)unitString);
    }
  }
  if (((un->base_units_).field_0x3 & 0x40) != 0) {
    if (unitString->_M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)unitString,0,(char *)0x0,0x192e64);
    }
    else {
      std::__cxx11::string::replace((ulong)unitString,0,(char *)0x0,0x1930f1);
    }
  }
  if (((un->base_units_).field_0x3 & 0x10) == 0) {
    return;
  }
  if (unitString->_M_string_length != 0) {
    std::__cxx11::string::replace((ulong)unitString,0,(char *)0x0,0x1930f8);
    return;
  }
  std::__cxx11::string::_M_replace((ulong)unitString,0,(char *)0x0,0x192e6a);
  return;
}

Assistant:

static void addUnitFlagStrings(const precise_unit& un, std::string& unitString)
{
    if (un.base_units().has_i_flag()) {
        if (unitString.empty()) {
            unitString = "flag";
        } else {
            unitString.append("*flag");
        }
    }
    if (un.base_units().has_e_flag()) {
        if (unitString.empty()) {
            unitString = "eflag";
        } else {
            unitString.insert(0, "eflag*");
        }
    }
    if (un.base_units().is_per_unit()) {
        if (unitString.empty()) {
            unitString = "pu";
        } else {
            unitString.insert(0, "pu*");
        }
    }
}